

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  undefined4 size_pixels;
  char *compressed_ttf_data_base85;
  ImWchar *glyph_ranges;
  ImFont *pIVar1;
  ImFont *font;
  char *ttf_compressed_base85;
  ImFontConfig font_cfg;
  ImFontConfig *font_cfg_template_local;
  ImFontAtlas *this_local;
  
  font_cfg.DstFont = (ImFont *)font_cfg_template;
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)&ttf_compressed_base85);
  }
  else {
    memcpy(&ttf_compressed_base85,font_cfg_template,0x78);
  }
  if (font_cfg.DstFont == (ImFont *)0x0) {
    font_cfg.SizePixels = 1.4013e-45;
    font_cfg.FontNo = 1;
    font_cfg.OversampleH._0_1_ = 1;
  }
  if ((char)font_cfg.RasterizerFlags == '\0') {
    strcpy((char *)&font_cfg.RasterizerFlags,"ProggyClean.ttf, 13px");
  }
  if ((float)font_cfg._12_4_ <= 0.0) {
    font_cfg.FontDataOwnedByAtlas = false;
    font_cfg._13_3_ = 0x415000;
  }
  compressed_ttf_data_base85 = GetDefaultCompressedFontDataTTFBase85();
  size_pixels = font_cfg._12_4_;
  glyph_ranges = GetGlyphRangesDefault(this);
  pIVar1 = AddFontFromMemoryCompressedBase85TTF
                     (this,compressed_ttf_data_base85,(float)size_pixels,
                      (ImFontConfig *)&ttf_compressed_base85,glyph_ranges);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.Name[0] == '\0') strcpy(font_cfg.Name, "ProggyClean.ttf, 13px");
    if (font_cfg.SizePixels <= 0.0f) font_cfg.SizePixels = 13.0f;

    const char* ttf_compressed_base85 = GetDefaultCompressedFontDataTTFBase85();
    ImFont* font = AddFontFromMemoryCompressedBase85TTF(ttf_compressed_base85, font_cfg.SizePixels, &font_cfg, GetGlyphRangesDefault());
    return font;
}